

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::RoundScalarWithFormatT<float>(char *format,ImGuiDataType data_type,float v)

{
  char *__nptr;
  char *in_RDI;
  float in_XMM0_Da;
  double dVar1;
  char *p;
  char v_str [64];
  char fmt_sanitized [32];
  char *fmt_start;
  size_t in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  undefined1 local_48 [40];
  char *local_20;
  float local_18;
  float local_4;
  
  local_18 = in_XMM0_Da;
  local_20 = ImParseFormatFindStart(in_RDI);
  if ((*local_20 == '%') && (local_20[1] != '%')) {
    ImParseFormatSanitizeForPrinting
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    local_20 = local_48;
    ImFormatString((char *)(double)local_18,(size_t)&stack0xffffffffffffff78,(char *)0x40,local_20);
    for (__nptr = &stack0xffffffffffffff78; *__nptr == ' '; __nptr = __nptr + 1) {
    }
    dVar1 = atof(__nptr);
    local_4 = (float)dVar1;
  }
  else {
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    IM_UNUSED(data_type);
    IM_ASSERT(data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    ImParseFormatSanitizeForPrinting(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    v = (TYPE)ImAtof(p);

    return v;
}